

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

void __thiscall embree::FastAllocator::internal_fix_used_blocks(FastAllocator *this)

{
  Block *pBVar1;
  size_t i;
  
  for (i = 0; i != 8; i = i + 1) {
    while (this->threadBlocks[i]._M_b._M_p != (__pointer_type)0x0) {
      pBVar1 = (this->threadBlocks[i]._M_b._M_p)->next;
      (this->threadBlocks[i]._M_b._M_p)->next = (this->usedBlocks)._M_b._M_p;
      LOCK();
      (this->usedBlocks)._M_b._M_p = this->threadBlocks[i]._M_b._M_p;
      UNLOCK();
      LOCK();
      this->threadBlocks[i]._M_b._M_p = pBVar1;
      UNLOCK();
    }
    LOCK();
    this->threadBlocks[i]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return;
}

Assistant:

void internal_fix_used_blocks()
    {
      /* move thread local blocks to global block list */
      for (size_t i = 0; i < MAX_THREAD_USED_BLOCK_SLOTS; i++)
      {
        while (threadBlocks[i].load() != nullptr) {
          Block* nextUsedBlock = threadBlocks[i].load()->next;
          threadBlocks[i].load()->next = usedBlocks.load();
          usedBlocks = threadBlocks[i].load();
          threadBlocks[i] = nextUsedBlock;
        }
        threadBlocks[i] = nullptr;
      }
    }